

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilTruth.h
# Opt level: O3

int Abc_Tt7Isop(word *uOn,word *uOnDc,int nVars,word *uRes)

{
  int *pnCubes;
  uint in_EAX;
  word wVar1;
  word wVar2;
  word wVar3;
  ulong uVar4;
  undefined4 in_register_00000014;
  word *pwVar5;
  ulong uVar6;
  int nCubes;
  undefined8 uStack_38;
  
  pwVar5 = (word *)CONCAT44(in_register_00000014,nVars);
  uStack_38 = (ulong)in_EAX;
  wVar1 = *uOn;
  if (wVar1 == uOn[1]) {
    wVar2 = *uOnDc;
    wVar3 = uOnDc[1];
    if (wVar2 == wVar3) {
      wVar1 = Abc_Tt6Isop(wVar1,wVar2,6,(int *)((long)&uStack_38 + 4));
      pwVar5[1] = wVar1;
      *pwVar5 = wVar1;
      goto LAB_006ebfac;
    }
  }
  else {
    wVar2 = *uOnDc;
    wVar3 = uOnDc[1];
  }
  pnCubes = (int *)((long)&uStack_38 + 4);
  wVar1 = Abc_Tt6Isop(wVar1 & ~wVar3,wVar2,6,pnCubes);
  wVar2 = Abc_Tt6Isop(~*uOnDc & uOn[1],uOnDc[1],6,pnCubes);
  wVar3 = Abc_Tt6Isop(~wVar2 & uOn[1] | ~wVar1 & *uOn,uOnDc[1] & *uOnDc,6,pnCubes);
  uVar6 = wVar1 | wVar3;
  *pwVar5 = uVar6;
  uVar4 = wVar3 | wVar2;
  pwVar5[1] = uVar4;
  if (((*uOn & ~uVar6) != 0) || ((uOn[1] & ~uVar4) != 0)) {
    __assert_fail("(uOn[0] & ~uRes[0]) == 0 && (uOn[1] & ~uRes[1]) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/utilTruth.h"
                  ,0x733,"int Abc_Tt7Isop(word *, word *, int, word *)");
  }
  if (((uVar6 & ~*uOnDc) != 0) || ((uVar4 & ~uOnDc[1]) != 0)) {
    __assert_fail("(uRes[0] & ~uOnDc[0])==0 && (uRes[1] & ~uOnDc[1])==0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/utilTruth.h"
                  ,0x734,"int Abc_Tt7Isop(word *, word *, int, word *)");
  }
LAB_006ebfac:
  return uStack_38._4_4_;
}

Assistant:

static inline int Abc_Tt7Isop( word uOn[2], word uOnDc[2], int nVars, word uRes[2] )
{
    int nCubes = 0;
    if ( nVars <= 6 || (uOn[0] == uOn[1] && uOnDc[0] == uOnDc[1]) )
        uRes[0] = uRes[1] = Abc_Tt6Isop( uOn[0], uOnDc[0], Abc_MinInt(nVars, 6), &nCubes );
    else
    {
        word uRes0, uRes1, uRes2;
        assert( nVars == 7 );
        // solve for cofactors
        uRes0 = Abc_Tt6Isop( uOn[0] & ~uOnDc[1], uOnDc[0], 6, &nCubes );
        uRes1 = Abc_Tt6Isop( uOn[1] & ~uOnDc[0], uOnDc[1], 6, &nCubes );
        uRes2 = Abc_Tt6Isop( (uOn[0] & ~uRes0) | (uOn[1] & ~uRes1), uOnDc[0] & uOnDc[1], 6, &nCubes );
        // derive the final truth table
        uRes[0] = uRes2 | uRes0;
        uRes[1] = uRes2 | uRes1;
        assert( (uOn[0] & ~uRes[0]) == 0 && (uOn[1] & ~uRes[1]) == 0 );
        assert( (uRes[0] & ~uOnDc[0])==0 && (uRes[1] & ~uOnDc[1])==0 );
    }
    return nCubes;
}